

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::double_writer::operator()
          (double_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  double_writer dVar1;
  double_writer *pdVar2;
  ulong uVar3;
  ulong uVar4;
  __copy_move<false,false,std::random_access_iterator_tag> *this_00;
  char *in_RCX;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_50;
  
  dVar1 = this[8];
  if (dVar1 != (double_writer)0x0) {
    pdVar2 = (double_writer *)(it->super_truncating_iterator_base<char_*>).out_;
    uVar3 = (it->super_truncating_iterator_base<char_*>).count_;
    uVar4 = (it->super_truncating_iterator_base<char_*>).limit_;
    internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++(it);
    if (uVar3 < uVar4) {
      *pdVar2 = dVar1;
    }
    *(long *)this = *(long *)this + -1;
  }
  this_00 = *(__copy_move<false,false,std::random_access_iterator_tag> **)
             (*(long *)(this + 0x10) + 8);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>>
            (&local_50,this_00,(char *)(this_00 + *(long *)(*(long *)(this + 0x10) + 0x10)),in_RCX,
             *it);
  *(ulong *)((long)&(it->super_truncating_iterator_base<char_*>).limit_ + 1) =
       CONCAT17((undefined1)local_50.super_truncating_iterator_base<char_*>.count_,
                local_50.super_truncating_iterator_base<char_*>.limit_._1_7_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<char_*>).count_ + 1) = local_50._17_8_;
  (it->super_truncating_iterator_base<char_*>).out_ =
       local_50.super_truncating_iterator_base<char_*>.out_;
  (it->super_truncating_iterator_base<char_*>).limit_ =
       CONCAT71(local_50.super_truncating_iterator_base<char_*>.limit_._1_7_,
                (undefined1)local_50.super_truncating_iterator_base<char_*>.limit_);
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }